

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.h
# Opt level: O0

void __thiscall
absl::lts_20240722::Cord::ChunkIterator::AdvanceBytesBtree(ChunkIterator *this,size_t n)

{
  size_type sVar1;
  size_type sVar2;
  string_view sVar3;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  size_t local_40;
  char *local_38;
  size_t local_30;
  size_t offset;
  char *local_20;
  size_type local_18;
  size_t n_local;
  ChunkIterator *this_local;
  
  local_18 = n;
  n_local = (size_t)this;
  sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size(&this->current_chunk_);
  sVar1 = local_18;
  if (n < sVar2) {
    __assert_fail("n >= current_chunk_.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/absl-src/absl/strings/cord.h"
                  ,0x60a,"void absl::Cord::ChunkIterator::AdvanceBytesBtree(size_t)");
  }
  this->bytes_remaining_ = this->bytes_remaining_ - local_18;
  if (this->bytes_remaining_ == 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_50);
    (this->current_chunk_)._M_len = local_50._M_len;
    (this->current_chunk_)._M_str = local_50._M_str;
  }
  else {
    sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size(&this->current_chunk_);
    if (sVar1 == sVar2) {
      sVar3 = cord_internal::CordRepBtreeReader::Next(&this->btree_reader_);
      offset = sVar3._M_len;
      (this->current_chunk_)._M_len = offset;
      local_20 = sVar3._M_str;
      (this->current_chunk_)._M_str = local_20;
    }
    else {
      local_30 = cord_internal::CordRepBtreeReader::length(&this->btree_reader_);
      local_30 = local_30 - this->bytes_remaining_;
      sVar3 = cord_internal::CordRepBtreeReader::Seek(&this->btree_reader_,local_30);
      local_40 = sVar3._M_len;
      (this->current_chunk_)._M_len = local_40;
      local_38 = sVar3._M_str;
      (this->current_chunk_)._M_str = local_38;
    }
  }
  return;
}

Assistant:

inline void Cord::ChunkIterator::AdvanceBytesBtree(size_t n) {
  assert(n >= current_chunk_.size());
  bytes_remaining_ -= n;
  if (bytes_remaining_) {
    if (n == current_chunk_.size()) {
      current_chunk_ = btree_reader_.Next();
    } else {
      size_t offset = btree_reader_.length() - bytes_remaining_;
      current_chunk_ = btree_reader_.Seek(offset);
    }
  } else {
    current_chunk_ = {};
  }
}